

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerRewriting.cpp
# Opt level: O1

bool __thiscall
Inferences::InnerRewriting::perform
          (InnerRewriting *this,Clause *cl,Clause **replacement,ClauseIterator *premises)

{
  Self SVar1;
  bool bVar2;
  Literal *pLVar3;
  ulong uVar4;
  Literal *pLVar5;
  Clause *pCVar6;
  ulong uVar7;
  int iVar8;
  Literal ***pppLVar9;
  ulong uVar10;
  uint k;
  ulong uVar11;
  bool bVar12;
  RStack<Literal_*> resLits;
  TermList rhs;
  TermList lhs;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_b8;
  TermList local_a8;
  TermList local_a0;
  Literal *local_98;
  Literal *local_90;
  ulong local_88;
  Ordering *local_80;
  Clause **local_78;
  SimplifyingInference1 local_70;
  Inference local_60;
  
  bVar2 = false;
  if ((*(ulong *)&cl->field_0x38 & 0xfffff) != 0) {
    local_80 = (((this->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->_ordering).
               _obj;
    uVar10 = (ulong)((uint)*(ulong *)&cl->field_0x38 & 0xfffff);
    uVar11 = 0;
    local_78 = replacement;
    do {
      pLVar5 = cl->_literals[uVar11];
      local_a0._content = 2;
      local_a8._content = 2;
      iVar8 = 0;
      if ((((pLVar5->super_Term)._functor == 0) &&
          (iVar8 = 0, ((pLVar5->super_Term)._args[0]._content & 4) == 0)) &&
         (bVar2 = Kernel::EqHelper::hasGreaterEqualitySide(pLVar5,local_80,&local_a0,&local_a8),
         bVar2)) {
        uVar7 = 0;
        local_90 = pLVar5;
        local_88 = uVar11;
        do {
          if (uVar11 != uVar7) {
            pLVar5 = cl->_literals[uVar7];
            pLVar3 = Kernel::EqHelper::replace(pLVar5,local_a0,local_a8);
            if (pLVar3 == pLVar5) {
              iVar8 = 0;
            }
            else if ((((pLVar3->super_Term)._functor == 0) &&
                     (((pLVar3->super_Term)._args[0]._content & 4) != 0)) &&
                    (uVar4 = (ulong)(*(uint *)&(pLVar3->super_Term).field_0xc & 0xfffffff),
                    (pLVar3->super_Term)._args[uVar4]._content ==
                    (pLVar3->super_Term)._args[uVar4 - 1]._content)) {
              *(int *)(DAT_00b7e1c0 + 0x1a4) = *(int *)(DAT_00b7e1c0 + 0x1a4) + 1;
              iVar8 = 1;
            }
            else {
              ::Lib::
              Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              Recycled(&local_b8);
              bVar2 = true;
              uVar11 = 0;
              local_98 = pLVar3;
              do {
                SVar1._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                     (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                      )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                        )local_b8._self;
                if (local_88 == uVar11) {
                  pLVar5 = local_90;
                  if (*(Literal ***)
                       ((long)local_b8._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x10) ==
                      *(Literal ***)
                       ((long)local_b8._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x18)) {
                    ::Lib::Stack<Kernel::Literal_*>::expand
                              ((Stack<Kernel::Literal_*> *)
                               local_b8._self._M_t.
                               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                               _M_head_impl);
                    pLVar5 = local_90;
                  }
LAB_004ffdf1:
                  pppLVar9 = (Literal ***)
                             ((long)SVar1._M_t.
                                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                    _M_head_impl + 0x10);
                  **pppLVar9 = pLVar5;
                  *pppLVar9 = *pppLVar9 + 1;
                }
                else {
                  if (uVar11 < uVar7) {
                    pLVar5 = cl->_literals[uVar11];
                    if (*(Literal ***)
                         ((long)local_b8._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10) ==
                        *(Literal ***)
                         ((long)local_b8._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x18)) {
                      ::Lib::Stack<Kernel::Literal_*>::expand
                                ((Stack<Kernel::Literal_*> *)
                                 local_b8._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                 _M_head_impl);
                    }
                    goto LAB_004ffdf1;
                  }
                  if (uVar11 == uVar7) {
                    pLVar5 = local_98;
                    if (*(Literal ***)
                         ((long)local_b8._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10) ==
                        *(Literal ***)
                         ((long)local_b8._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x18)) {
                      ::Lib::Stack<Kernel::Literal_*>::expand
                                ((Stack<Kernel::Literal_*> *)
                                 local_b8._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                 _M_head_impl);
                      pLVar5 = local_98;
                    }
                    goto LAB_004ffdf1;
                  }
                  pLVar5 = Kernel::EqHelper::replace(cl->_literals[uVar11],local_a0,local_a8);
                  SVar1._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                       (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                        )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                          )local_b8._self;
                  if (((pLVar5->super_Term)._functor == 0) &&
                     (((pLVar5->super_Term)._args[0]._content & 4) != 0)) {
                    uVar4 = (ulong)(*(uint *)&(pLVar5->super_Term).field_0xc & 0xfffffff);
                    bVar12 = (pLVar5->super_Term)._args[uVar4]._content ==
                             (pLVar5->super_Term)._args[uVar4 - 1]._content;
                  }
                  else {
                    bVar12 = false;
                  }
                  if (bVar12) {
                    *(int *)(DAT_00b7e1c0 + 0x1a4) = *(int *)(DAT_00b7e1c0 + 0x1a4) + 1;
                  }
                  else {
                    if (*(Literal ***)
                         ((long)local_b8._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10) ==
                        *(Literal ***)
                         ((long)local_b8._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x18)) {
                      ::Lib::Stack<Kernel::Literal_*>::expand
                                ((Stack<Kernel::Literal_*> *)
                                 local_b8._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                 _M_head_impl);
                    }
                    **(Literal ***)
                      ((long)SVar1._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                             _M_head_impl + 0x10) = pLVar5;
                    pppLVar9 = (Literal ***)
                               ((long)SVar1._M_t.
                                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                      ._M_head_impl + 0x10);
                    *pppLVar9 = *pppLVar9 + 1;
                  }
                  if (bVar12) {
                    iVar8 = 1;
                    goto LAB_004ffebb;
                  }
                }
                uVar11 = uVar11 + 1;
                bVar2 = uVar11 < uVar10;
              } while (uVar11 != uVar10);
              iVar8 = 8;
LAB_004ffebb:
              uVar11 = local_88;
              SVar1._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                   (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                    )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                      )local_b8._self;
              if (!bVar2) {
                *(int *)(DAT_00b7e1c0 + 0x1a0) = *(int *)(DAT_00b7e1c0 + 0x1a0) + 1;
                local_70.rule = INNER_REWRITING;
                local_70.premise = cl;
                Kernel::Inference::Inference(&local_60,&local_70);
                pCVar6 = Kernel::Clause::fromStack
                                   ((Stack<Kernel::Literal_*> *)
                                    SVar1._M_t.
                                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                    _M_head_impl,&local_60);
                *local_78 = pCVar6;
                iVar8 = 1;
              }
              ::Lib::
              Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              ~Recycled(&local_b8);
            }
            if (iVar8 != 0) goto LAB_004fff4b;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar10);
        iVar8 = 5;
LAB_004fff4b:
        if (iVar8 == 5) {
          iVar8 = 0;
        }
      }
      if (iVar8 != 0) goto LAB_004fff6b;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
    iVar8 = 2;
LAB_004fff6b:
    bVar2 = iVar8 != 2;
  }
  return bVar2;
}

Assistant:

bool InnerRewriting::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  Ordering& ordering = _salg->getOrdering();

  // look for the first equality which rewrites something and rewrite everything with it (check for EqTaut as you go)
  unsigned len = cl->length();
  for (unsigned i = 0; i < len; i++) {
    Literal* rwLit=(*cl)[i];
    TermList lhs, rhs;
    if (rwLit->isEquality() && rwLit->isNegative() && EqHelper::hasGreaterEqualitySide(rwLit,ordering,lhs,rhs)) {
      for (unsigned j = 0; j < len; j++) {
        if (i != j) {
          Literal* lit = (*cl)[j];
          Literal* nLit = EqHelper::replace(lit,lhs,rhs);
          if (nLit != lit) {
            if(EqHelper::isEqTautology(nLit)) {
              env.statistics->innerRewritesToEqTaut++;
              return true;
            }

            RStack<Literal*> resLits;

            for (unsigned k = 0; k < len; k++) {
              if (k == i) {
                resLits->push(rwLit);
              } else if (k < j) {
                resLits->push((*cl)[k]);
              } else if (k == j) {
                resLits->push(nLit);
              } else {
                Literal* oLit = (*cl)[k];
                Literal* rLit = EqHelper::replace(oLit,lhs,rhs);
                if(EqHelper::isEqTautology(rLit)) {
                  env.statistics->innerRewritesToEqTaut++;
                  return true;
                }
                resLits->push(rLit);
              }
            }

            env.statistics->innerRewrites++;

            replacement = Clause::fromStack(*resLits,SimplifyingInference1(InferenceRule::INNER_REWRITING, cl));
            return true;
          }
        }
      }
    }
  }

  return false;
}